

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

uint32_t EOPLL_setMask(EOPLL *opll,uint32_t mask)

{
  uint32_t ret;
  uint32_t mask_local;
  EOPLL *opll_local;
  
  if (opll == (EOPLL *)0x0) {
    opll_local._4_4_ = 0;
  }
  else {
    opll_local._4_4_ = opll->mask;
    opll->mask = mask;
  }
  return opll_local._4_4_;
}

Assistant:

uint32_t EOPLL_setMask(EOPLL *opll, uint32_t mask) {
  uint32_t ret;

  if (opll) {
    ret = opll->mask;
    opll->mask = mask;
    return ret;
  } else
    return 0;
}